

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relocs.c
# Opt level: O3

void write_relocs(void)

{
  reloc_entry_t reloc;
  block_header_t header;
  reloc_entry_t local_28;
  block_header_t local_10;
  
  if (relocs_count != 0) {
    local_10.type = relocations;
    local_10.num_entries = relocs_count;
    write_block_header(&local_10);
    for (cur = root; cur != (reloc_t *)0x0; cur = cur->next) {
      local_28.sym_id = cur->sym_id;
      local_28.section_id = cur->section_id;
      local_28.offset = cur->offset;
      local_28.flags = cur->flags;
      write_reloc_entry(&local_28);
    }
  }
  return;
}

Assistant:

void write_relocs()
{
    block_header_t header;
    reloc_entry_t reloc;
    if (relocs_count == 0)
        return;
    
    header.type = relocations;
    header.num_entries = relocs_count;
    write_block_header(&header);
    
    cur = root;
    while (cur)
    {
        reloc.sym_id = cur->sym_id;
        reloc.section_id = cur->section_id;
        reloc.offset = cur->offset;
        reloc.flags = cur->flags;
        write_reloc_entry(&reloc);
        cur = cur->next;
    }
}